

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O2

const_iterator * __thiscall
compressed_sparse_matrix<filtration_entry_t>::cend
          (const_iterator *__return_storage_ptr__,compressed_sparse_matrix<filtration_entry_t> *this
          ,size_t index)

{
  size_type sVar1;
  reference puVar2;
  _Self local_48;
  
  sVar1 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->bounds);
  if (index < sVar1) {
    local_48._M_cur =
         (this->entries).super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
         _M_impl.super__Deque_impl_data._M_start._M_cur;
    local_48._M_first =
         (this->entries).super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
         _M_impl.super__Deque_impl_data._M_start._M_first;
    local_48._M_last =
         (this->entries).super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
         _M_impl.super__Deque_impl_data._M_start._M_last;
    local_48._M_node =
         (this->entries).super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
         _M_impl.super__Deque_impl_data._M_start._M_node;
    puVar2 = std::_Deque_iterator<unsigned_long,_unsigned_long_&,_unsigned_long_*>::operator[]
                       (&(this->bounds).
                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Deque_impl_data._M_start,index);
    std::operator+(__return_storage_ptr__,&local_48,*puVar2);
    return __return_storage_ptr__;
  }
  __assert_fail("index < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JasonPSmith[P]tournser/pytournser/../tournser.cpp"
                ,0xaf,
                "typename std::deque<ValueType>::const_iterator compressed_sparse_matrix<filtration_entry_t>::cend(size_t) const [ValueType = filtration_entry_t]"
               );
}

Assistant:

typename std::deque<ValueType>::const_iterator cend(size_t index) const {
		assert(index < size());
		return entries.cbegin() + bounds[index];
	}